

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall libtorrent::aux::socks5::on_connect_timeout(socks5 *this,error_code *e)

{
  bool bVar1;
  undefined1 local_40 [8];
  error_code ignore;
  error_code local_28;
  error_code *local_18;
  error_code *e_local;
  socks5 *this_local;
  
  local_18 = e;
  e_local = (error_code *)this;
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            (&local_28,operation_aborted,(type *)0x0);
  bVar1 = boost::system::operator==(e,&local_28);
  if ((!bVar1) && ((this->m_abort & 1U) == 0)) {
    bVar1 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts);
    if (bVar1) {
      ignore.cat_._7_1_ = 0x10;
      ignore.cat_._0_4_ = 0x24;
      alert_manager::
      emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,libtorrent::errors::error_code_enum>
                (this->m_alerts,&this->m_proxy_addr,(operation_t *)((long)&ignore.cat_ + 7),
                 (error_code_enum *)&ignore.cat_);
    }
    boost::system::error_code::error_code((error_code *)local_40);
    boost::asio::
    basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::close((basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)&this->m_socks5_sock,(int)local_40);
    this->m_failures = this->m_failures + 1;
    retry_connection(this);
  }
  return;
}

Assistant:

void socks5::on_connect_timeout(error_code const& e)
{
	COMPLETE_ASYNC("socks5::on_connect_timeout");

	if (e == boost::asio::error::operation_aborted) return;

	if (m_abort) return;

	if (m_alerts.should_post<socks5_alert>())
		m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::connect, errors::timed_out);

	error_code ignore;
	m_socks5_sock.close(ignore);

	++m_failures;
	retry_connection();
}